

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O1

int create_framebuffers(Init *init,RenderData *data)

{
  VkResult VVar1;
  pointer ppVVar2;
  char *__function;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  VkFramebufferCreateInfo framebuffer_info;
  VkImageView attachments [1];
  anon_union_24_2_293c120a_for_Result<std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>_>_1
  local_88;
  VkRenderPass pVStack_70;
  undefined8 local_68;
  VkImageView_T **ppVStack_60;
  VkExtent2D local_58;
  undefined8 uStack_50;
  VkImageView_T *local_48;
  pointer local_40;
  pointer ppVStack_38;
  
  vkb::Swapchain::get_images
            ((Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_> *)&local_88.m_value,
             &init->swapchain);
  if ((char)pVStack_70 == '\0') {
    __function = 
    "T vkb::Result<std::vector<VkImage_T *>>::value() && [T = std::vector<VkImage_T *>]";
  }
  else {
    local_48 = (VkImageView_T *)
               local_88.m_value.
               super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_40 = local_88.m_value.
               super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    ppVStack_38 = local_88.m_value.
                  super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    local_88.m_value.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.m_value.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.m_value.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>::_M_move_assign
              (&data->swapchain_images,&local_48);
    if (local_48 != (VkImageView_T *)0x0) {
      operator_delete(local_48,(long)ppVStack_38 - (long)local_48);
    }
    if (((char)pVStack_70 == '\x01') &&
       (local_88.m_value.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
      operator_delete(local_88.m_value.
                      super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_88.m_value.
                            super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage - local_88._0_8_);
    }
    vkb::Swapchain::get_image_views
              ((Result<std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>_> *)
               &local_88.m_value,&init->swapchain);
    if ((char)pVStack_70 != '\0') {
      local_48 = (VkImageView_T *)
                 local_88.m_value.
                 super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_40 = local_88.m_value.
                 super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      ppVStack_38 = local_88.m_value.
                    super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
      local_88.m_value.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.m_value.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.m_value.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>::_M_move_assign
                (&data->swapchain_image_views,&local_48);
      if (local_48 != (VkImageView_T *)0x0) {
        operator_delete(local_48,(long)ppVStack_38 - (long)local_48);
      }
      if (((char)pVStack_70 == '\x01') &&
         (local_88.m_value.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        operator_delete(local_88.m_value.
                        super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_88.m_value.
                              super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage - local_88._0_8_);
      }
      std::vector<VkFramebuffer_T_*,_std::allocator<VkFramebuffer_T_*>_>::resize
                (&data->framebuffers,
                 (long)(data->swapchain_image_views).
                       super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                 (long)(data->swapchain_image_views).
                       super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl
                       .super__Vector_impl_data._M_start >> 3);
      ppVVar2 = (data->swapchain_image_views).
                super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      bVar5 = (data->swapchain_image_views).
              super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
              super__Vector_impl_data._M_finish != ppVVar2;
      if (bVar5) {
        lVar4 = 0;
        uVar3 = 0;
        do {
          local_48 = ppVVar2[uVar3];
          local_88.m_value.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_88.m_value.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_88.m_value.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x25;
          pVStack_70 = data->render_pass;
          local_68 = 1;
          ppVStack_60 = &local_48;
          local_58 = (init->swapchain).extent;
          uStack_50 = 1;
          VVar1 = (*(init->disp).fp_vkCreateFramebuffer)
                            ((init->disp).device,(VkFramebufferCreateInfo *)&local_88.m_value,
                             (VkAllocationCallbacks *)0x0,
                             (VkFramebuffer *)
                             ((long)(data->framebuffers).
                                    super__Vector_base<VkFramebuffer_T_*,_std::allocator<VkFramebuffer_T_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar4));
          if (VVar1 != VK_SUCCESS) break;
          uVar3 = uVar3 + 1;
          ppVVar2 = (data->swapchain_image_views).
                    super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          lVar4 = lVar4 + 8;
          bVar5 = uVar3 < (ulong)((long)(data->swapchain_image_views).
                                        super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar2
                                 >> 3);
        } while (bVar5);
      }
      return -(uint)bVar5;
    }
    __function = 
    "T vkb::Result<std::vector<VkImageView_T *>>::value() && [T = std::vector<VkImageView_T *>]";
  }
  __assert_fail("m_init",
                "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/src/VkBootstrap.h"
                ,0x89,__function);
}

Assistant:

int create_framebuffers(Init& init, RenderData& data) {
    data.swapchain_images = init.swapchain.get_images().value();
    data.swapchain_image_views = init.swapchain.get_image_views().value();

    data.framebuffers.resize(data.swapchain_image_views.size());

    for (size_t i = 0; i < data.swapchain_image_views.size(); i++) {
        VkImageView attachments[] = { data.swapchain_image_views[i] };

        VkFramebufferCreateInfo framebuffer_info = {};
        framebuffer_info.sType = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
        framebuffer_info.renderPass = data.render_pass;
        framebuffer_info.attachmentCount = 1;
        framebuffer_info.pAttachments = attachments;
        framebuffer_info.width = init.swapchain.extent.width;
        framebuffer_info.height = init.swapchain.extent.height;
        framebuffer_info.layers = 1;

        if (init.disp.createFramebuffer(&framebuffer_info, nullptr, &data.framebuffers[i]) != VK_SUCCESS) {
            return -1; // failed to create framebuffer
        }
    }
    return 0;
}